

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O3

void dumpInfoDict(QPDF *pdf,ostream *os,string *sep)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char cVar2;
  ulong uVar3;
  ostream *poVar4;
  string val;
  QPDFObjectHandle trailer;
  iterator __begin2;
  iterator __end2;
  char *local_128;
  long local_120;
  char local_118;
  undefined7 uStack_117;
  long *local_108;
  long local_100;
  long local_f8 [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  string local_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ostream *local_c8;
  iterator local_c0;
  iterator local_78;
  
  local_c8 = os;
  QPDF::getTrailer();
  p_Var1 = &local_c0.m.
            super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_c0._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/Info","");
  cVar2 = QPDFObjectHandle::hasKey(local_d8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c0._vptr_iterator != p_Var1) {
    operator_delete(local_c0._vptr_iterator,
                    (ulong)(local_c0.m.
                            super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 1));
  }
  if (cVar2 != '\0') {
    local_c0._vptr_iterator = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"/Info","");
    QPDFObjectHandle::getKey((string *)&local_78);
    QPDFObjectHandle::ditems();
    if (local_78.m.
        super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_78.m.
                 super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_c0._vptr_iterator != p_Var1) {
      operator_delete(local_c0._vptr_iterator,
                      (ulong)(local_c0.m.
                              super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi + 1));
    }
    QPDFObjectHandle::QPDFDictItems::begin();
    QPDFObjectHandle::QPDFDictItems::end();
    while( true ) {
      cVar2 = QPDFObjectHandle::QPDFDictItems::iterator::operator==(&local_c0,&local_78);
      if (cVar2 != '\0') break;
      uVar3 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
      local_128 = &local_118;
      local_120 = 0;
      local_118 = '\0';
      cVar2 = QPDFObjectHandle::isString();
      if (cVar2 == '\0') {
        cVar2 = QPDFObjectHandle::isName();
        if (cVar2 == '\0') {
          QPDFObjectHandle::unparseResolved_abi_cxx11_();
        }
        else {
          QPDFObjectHandle::getName_abi_cxx11_();
        }
      }
      else {
        QPDFObjectHandle::getStringValue_abi_cxx11_();
      }
      std::__cxx11::string::operator=((string *)&local_128,(string *)&local_108);
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      std::__cxx11::string::substr((ulong)&local_108,uVar3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_c8,(char *)local_108,local_100);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(sep->_M_dataplus)._M_p,sep->_M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_128,local_120);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
      }
      QPDFObjectHandle::QPDFDictItems::iterator::operator++(&local_c0);
    }
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&local_78);
    QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&local_c0);
    if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
    }
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  return;
}

Assistant:

void
dumpInfoDict(QPDF& pdf, std::ostream& os = std::cout, std::string const& sep = ":\t")
{
    QPDFObjectHandle trailer = pdf.getTrailer();
    if (trailer.hasKey("/Info")) {
        for (auto& it: trailer.getKey("/Info").ditems()) {
            std::string val;
            if (it.second.isString()) {
                val = it.second.getStringValue();
            } else if (it.second.isName()) {
                val = it.second.getName();
            } else // according to PDF Spec 1.5, shouldn't happen
            {
                val = it.second.unparseResolved();
            }
            os << it.first.substr(1) << sep << val << std::endl; // skip '/'
        }
    }
}